

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AvgTest8bpp_avg_8x8_quad_MaxValue_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AvgTest8bpp_avg_8x8_quad_MaxValue_Test>
           *this)

{
  AverageTest_8x8_quad<unsigned_char> *this_00;
  
  WithParamInterface<std::tuple<int,int,int,int,int,void(*)(unsigned_char_const*,int,int,int,int*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (AverageTest_8x8_quad<unsigned_char> *)operator_new(0x48);
  anon_unknown.dwarf_171beb8::AverageTest_8x8_quad<unsigned_char>::AverageTest_8x8_quad(this_00);
  (this_00->super_AverageTestBase<unsigned_char>).super_Test._vptr_Test =
       (_func_int **)&PTR__AverageTest_8x8_quad_00f43d00;
  (this_00->
  super_WithParamInterface<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__AvgTest8bpp_avg_8x8_quad_MaxValue_Test_00f43d40;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }